

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriter.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::StringWriter::getFileExtensionWithDot_abi_cxx11_(StringWriter *this)

{
  long in_RSI;
  string *in_RDI;
  
  ::std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x28));
  return in_RDI;
}

Assistant:

std::string StringWriter::getFileExtensionWithDot() const
    {
        return ext;
    }